

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_generated.h
# Opt level: O1

bool __thiscall reflection::Enum::Verify(Enum *this,Verifier *verifier)

{
  bool bVar1;
  ushort uVar2;
  String *pSVar3;
  Enum *pEVar4;
  Vector<flatbuffers::Offset<reflection::EnumVal>,_unsigned_int> *vec;
  Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *vec_00;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *vec_01;
  Type *this_00;
  
  bVar1 = flatbuffers::VerifierTemplate<false>::VerifyTableStart(verifier,(uint8_t *)this);
  if ((bVar1) &&
     (bVar1 = flatbuffers::Table::VerifyOffsetRequired<unsigned_int>(&this->super_Table,verifier,4),
     bVar1)) {
    if (*(ushort *)(this + -(long)*(int *)this) < 5) {
      uVar2 = 0;
    }
    else {
      uVar2 = *(ushort *)(this + (4 - (long)*(int *)this));
    }
    if (uVar2 == 0) {
      pSVar3 = (String *)0x0;
    }
    else {
      pSVar3 = (String *)(this + (ulong)*(uint *)(this + uVar2) + (ulong)uVar2);
    }
    bVar1 = flatbuffers::VerifierTemplate<false>::VerifyString(verifier,pSVar3);
    if ((bVar1) &&
       (bVar1 = flatbuffers::Table::VerifyOffsetRequired<unsigned_int>
                          (&this->super_Table,verifier,6), bVar1)) {
      if (*(ushort *)(this + -(long)*(int *)this) < 7) {
        uVar2 = 0;
      }
      else {
        uVar2 = *(ushort *)(this + (6 - (long)*(int *)this));
      }
      if (uVar2 == 0) {
        pEVar4 = (Enum *)0x0;
      }
      else {
        pEVar4 = this + (ulong)*(uint *)(this + uVar2) + (ulong)uVar2;
      }
      if ((pEVar4 != (Enum *)0x0) &&
         (bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOrString<unsigned_int>
                            (verifier,(uint8_t *)pEVar4,4,(size_t *)0x0), !bVar1)) {
        return false;
      }
      if (*(ushort *)(this + -(long)*(int *)this) < 7) {
        uVar2 = 0;
      }
      else {
        uVar2 = *(ushort *)(this + (6 - (long)*(int *)this));
      }
      if (uVar2 == 0) {
        vec = (Vector<flatbuffers::Offset<reflection::EnumVal>,_unsigned_int> *)0x0;
      }
      else {
        vec = (Vector<flatbuffers::Offset<reflection::EnumVal>,_unsigned_int> *)
              (this + (ulong)*(uint *)(this + uVar2) + (ulong)uVar2);
      }
      bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOfTables<reflection::EnumVal>
                        (verifier,vec);
      if (bVar1) {
        if (*(ushort *)(this + -(long)*(int *)this) < 9) {
          uVar2 = 0;
        }
        else {
          uVar2 = *(ushort *)(this + (8 - (long)*(int *)this));
        }
        if (uVar2 != 0) {
          if (verifier->size_ < 2) {
            return false;
          }
          if ((Enum *)(verifier->size_ - 1) < this + ((ulong)uVar2 - (long)verifier->buf_)) {
            return false;
          }
        }
        bVar1 = flatbuffers::Table::VerifyOffsetRequired<unsigned_int>
                          (&this->super_Table,verifier,10);
        if (bVar1) {
          if (*(ushort *)(this + -(long)*(int *)this) < 0xb) {
            uVar2 = 0;
          }
          else {
            uVar2 = *(ushort *)(this + (10 - (long)*(int *)this));
          }
          if (uVar2 == 0) {
            this_00 = (Type *)0x0;
          }
          else {
            this_00 = (Type *)(this + (ulong)*(uint *)(this + uVar2) + (ulong)uVar2);
          }
          if (((this_00 == (Type *)0x0) || (bVar1 = Type::Verify(this_00,verifier), bVar1)) &&
             (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>
                                (&this->super_Table,verifier,0xc), bVar1)) {
            if (*(ushort *)(this + -(long)*(int *)this) < 0xd) {
              uVar2 = 0;
            }
            else {
              uVar2 = *(ushort *)(this + (0xc - (long)*(int *)this));
            }
            if (uVar2 == 0) {
              pEVar4 = (Enum *)0x0;
            }
            else {
              pEVar4 = this + (ulong)*(uint *)(this + uVar2) + (ulong)uVar2;
            }
            if ((pEVar4 != (Enum *)0x0) &&
               (bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOrString<unsigned_int>
                                  (verifier,(uint8_t *)pEVar4,4,(size_t *)0x0), !bVar1)) {
              return false;
            }
            if (*(ushort *)(this + -(long)*(int *)this) < 0xd) {
              uVar2 = 0;
            }
            else {
              uVar2 = *(ushort *)(this + (0xc - (long)*(int *)this));
            }
            if (uVar2 == 0) {
              vec_00 = (Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *)0x0;
            }
            else {
              vec_00 = (Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *)
                       (this + (ulong)*(uint *)(this + uVar2) + (ulong)uVar2);
            }
            bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOfTables<reflection::KeyValue>
                              (verifier,vec_00);
            if ((bVar1) &&
               (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>
                                  (&this->super_Table,verifier,0xe), bVar1)) {
              if (*(ushort *)(this + -(long)*(int *)this) < 0xf) {
                uVar2 = 0;
              }
              else {
                uVar2 = *(ushort *)(this + (0xe - (long)*(int *)this));
              }
              if (uVar2 == 0) {
                pEVar4 = (Enum *)0x0;
              }
              else {
                pEVar4 = this + (ulong)*(uint *)(this + uVar2) + (ulong)uVar2;
              }
              if ((pEVar4 != (Enum *)0x0) &&
                 (bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOrString<unsigned_int>
                                    (verifier,(uint8_t *)pEVar4,4,(size_t *)0x0), !bVar1)) {
                return false;
              }
              if (*(ushort *)(this + -(long)*(int *)this) < 0xf) {
                uVar2 = 0;
              }
              else {
                uVar2 = *(ushort *)(this + (0xe - (long)*(int *)this));
              }
              if (uVar2 == 0) {
                vec_01 = (Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *)0x0;
              }
              else {
                vec_01 = (Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *)
                         (this + (ulong)*(uint *)(this + uVar2) + (ulong)uVar2);
              }
              bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOfStrings(verifier,vec_01);
              if ((bVar1) &&
                 (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>
                                    (&this->super_Table,verifier,0x10), bVar1)) {
                if (*(ushort *)(this + -(long)*(int *)this) < 0x11) {
                  uVar2 = 0;
                }
                else {
                  uVar2 = *(ushort *)(this + (0x10 - (long)*(int *)this));
                }
                if (uVar2 == 0) {
                  pSVar3 = (String *)0x0;
                }
                else {
                  pSVar3 = (String *)(this + (ulong)*(uint *)(this + uVar2) + (ulong)uVar2);
                }
                bVar1 = flatbuffers::VerifierTemplate<false>::VerifyString(verifier,pSVar3);
                if (bVar1) {
                  verifier->depth_ = verifier->depth_ - 1;
                  return true;
                }
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool Verify(::flatbuffers::Verifier &verifier) const {
    return VerifyTableStart(verifier) &&
           VerifyOffsetRequired(verifier, VT_NAME) &&
           verifier.VerifyString(name()) &&
           VerifyOffsetRequired(verifier, VT_VALUES) &&
           verifier.VerifyVector(values()) &&
           verifier.VerifyVectorOfTables(values()) &&
           VerifyField<uint8_t>(verifier, VT_IS_UNION, 1) &&
           VerifyOffsetRequired(verifier, VT_UNDERLYING_TYPE) &&
           verifier.VerifyTable(underlying_type()) &&
           VerifyOffset(verifier, VT_ATTRIBUTES) &&
           verifier.VerifyVector(attributes()) &&
           verifier.VerifyVectorOfTables(attributes()) &&
           VerifyOffset(verifier, VT_DOCUMENTATION) &&
           verifier.VerifyVector(documentation()) &&
           verifier.VerifyVectorOfStrings(documentation()) &&
           VerifyOffset(verifier, VT_DECLARATION_FILE) &&
           verifier.VerifyString(declaration_file()) &&
           verifier.EndTable();
  }